

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void __thiscall CLI::detail::Number::Number(Number *this)

{
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"NUMBER",&local_31);
  Validator::Validator(&this->super_Validator,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,(anon_class_1_0_00000001 *)&local_31);
  return;
}

Assistant:

Number() : Validator("NUMBER") {
        func_ = [](std::string &number_str) {
            double number;
            if(!detail::lexical_cast(number_str, number)) {
                return std::string("Failed parsing as a number (") + number_str + ')';
            }
            return std::string();
        };
    }